

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<int,_unsigned_int>::resize(sqvector<int,_unsigned_int> *this,size_type newsize,int *fill)

{
  uint uVar1;
  int *piVar2;
  
  if (this->_allocated < newsize) {
    piVar2 = (int *)sq_vm_realloc(this->_alloc_ctx,this->_vals,(ulong)this->_allocated << 2,
                                  (ulong)newsize << 2);
    this->_vals = piVar2;
    this->_allocated = newsize;
  }
  uVar1 = this->_size;
  if (uVar1 < newsize) {
    piVar2 = this->_vals;
    do {
      piVar2[uVar1] = *fill;
      uVar1 = this->_size + 1;
      this->_size = uVar1;
    } while (uVar1 < newsize);
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }